

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_bool>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_bool>_> *base,
          tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<bool>_>
          *generators,bool is_end)

{
  ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_bool>_> *in_RSI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *in_RDI;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
  *in_stack_ffffffffffffff68;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
  *in_stack_ffffffffffffff70;
  ParamGenerator<bool> *in_stack_ffffffffffffff78;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
  *in_stack_ffffffffffffff80;
  
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_bool>_>::
  ParamIteratorInterface
            (&in_RDI->
              super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_bool>_>
            );
  (in_RDI->super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_bool>_>).
  _vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01f58078;
  in_RDI->base_ = in_RSI;
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<bool>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<bool>_>
              *)0x61a9be);
  ParamGenerator<const_libaom_test::CodecFactory_*>::begin
            ((ParamGenerator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff78);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<bool>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<bool>_>
              *)0x61a9da);
  ParamGenerator<int>::begin((ParamGenerator<int> *)in_stack_ffffffffffffff78);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<bool>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<bool>_>
              *)0x61a9f6);
  ParamGenerator<bool>::begin(in_stack_ffffffffffffff78);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>,_true,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff78,
             (ParamIterator<int> *)in_stack_ffffffffffffff70,
             (ParamIterator<bool> *)in_stack_ffffffffffffff68);
  ParamIterator<bool>::~ParamIterator((ParamIterator<bool> *)0x61aa2a);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x61aa34);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x61aa3e);
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<bool>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<bool>_>
              *)0x61aa59);
  ParamGenerator<const_libaom_test::CodecFactory_*>::end
            ((ParamGenerator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff78);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<bool>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<bool>_>
              *)0x61aa75);
  ParamGenerator<int>::end((ParamGenerator<int> *)in_stack_ffffffffffffff78);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<bool>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<bool>_>
              *)0x61aa91);
  ParamGenerator<bool>::end(in_stack_ffffffffffffff78);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>,_true,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff78,
             (ParamIterator<int> *)in_stack_ffffffffffffff70,
             (ParamIterator<bool> *)in_stack_ffffffffffffff68);
  ParamIterator<bool>::~ParamIterator((ParamIterator<bool> *)0x61aac5);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x61aacf);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x61aad9);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
  ::tuple(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_int,_bool>_>::shared_ptr
            ((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_int,_bool>_> *)0x61ab30);
  ComputeCurrentValue(in_RDI);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }